

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

void ReportHeader(lemon *lemp)

{
  int iVar1;
  FILE *pFVar2;
  char *pcVar3;
  ulong uVar4;
  char *pcVar5;
  char pattern [1000];
  char line [1000];
  char acStack_808 [1008];
  char local_418 [1000];
  
  pcVar5 = "";
  if (lemp->tokenprefix != (char *)0x0) {
    pcVar5 = lemp->tokenprefix;
  }
  pFVar2 = (FILE *)file_open(lemp,".h","rb");
  if (pFVar2 != (FILE *)0x0) {
    if (1 < lemp->nterminal) {
      uVar4 = 1;
      while( true ) {
        pcVar3 = fgets(local_418,1000,pFVar2);
        if (pcVar3 == (char *)0x0) break;
        sprintf(acStack_808,"#define %s%-30s %2d\n",pcVar5,lemp->symbols[uVar4]->name,
                uVar4 & 0xffffffff);
        iVar1 = strcmp(local_418,acStack_808);
        if ((iVar1 != 0) || (uVar4 = uVar4 + 1, (long)lemp->nterminal <= (long)uVar4)) break;
      }
    }
    fgetc(pFVar2);
    fclose(pFVar2);
  }
  pFVar2 = (FILE *)file_open(lemp,".h","wb");
  if (pFVar2 != (FILE *)0x0) {
    if (1 < lemp->nterminal) {
      uVar4 = 1;
      do {
        fprintf(pFVar2,"#define %s%-30s %3d\n",pcVar5,lemp->symbols[uVar4]->name,uVar4 & 0xffffffff)
        ;
        uVar4 = uVar4 + 1;
      } while ((long)uVar4 < (long)lemp->nterminal);
    }
    fclose(pFVar2);
  }
  return;
}

Assistant:

void ReportHeader(struct lemon *lemp)
{
  FILE *out, *in;
  const char *prefix;
  char line[LINESIZE];
  char pattern[LINESIZE];
  int i;

  if( lemp->tokenprefix ) prefix = lemp->tokenprefix;
  else                    prefix = "";
  in = file_open(lemp,".h","rb");
  if( in ){
    int nextChar;
    for(i=1; i<lemp->nterminal && fgets(line,LINESIZE,in); i++){
      sprintf(pattern,"#define %s%-30s %2d\n",
              prefix,lemp->symbols[i]->name,i);
      if( strcmp(line,pattern) ) break;
    }
    nextChar = fgetc(in);
    fclose(in);
    if( i==lemp->nterminal && nextChar==EOF ){
      /* No change in the file.  Don't rewrite it. */
      /* (not the best idea if you use make tools that check the date! */
      /*return;*/
    }
  }
  out = file_open(lemp,".h","wb");
  if( out ){
    for(i=1; i<lemp->nterminal; i++){
      fprintf(out,"#define %s%-30s %3d\n",prefix,lemp->symbols[i]->name,i);
    }
    fclose(out);  
  }
  return;
}